

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_genkey.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  
  mbedtls_ctr_drbg_init(&ctr_drbg);
  mbedtls_rsa_init(&rsa,0,0);
  mbedtls_mpi_init(&N);
  mbedtls_mpi_init(&P);
  mbedtls_mpi_init(&Q);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&DP);
  mbedtls_mpi_init(&DQ);
  mbedtls_mpi_init(&QP);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&entropy);
  uVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"rsa_genkey",10);
  if (uVar1 == 0) {
    printf(" ok\n  . Generating the RSA key [ %d-bit ]...",0x800);
    fflush(_stdout);
    uVar1 = mbedtls_rsa_gen_key(&rsa,mbedtls_ctr_drbg_random,&ctr_drbg,0x800,0x10001);
    if (uVar1 != 0) {
      pcVar3 = " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n";
      goto LAB_0010741b;
    }
    printf(" ok\n  . Exporting the public  key in rsa_pub.txt....");
    fflush(_stdout);
    iVar2 = mbedtls_rsa_export(&rsa,&N,&P,&Q,&D,&E);
    if ((iVar2 == 0) && (iVar2 = mbedtls_rsa_export_crt(&rsa,&DP,&DQ,&QP), iVar2 == 0)) {
      __stream = fopen("rsa_pub.txt","wb+");
      if (__stream != (FILE *)0x0) {
        uVar1 = mbedtls_mpi_write_file("N = ",&N,0x10,(FILE *)__stream);
        if ((uVar1 == 0) &&
           (uVar1 = mbedtls_mpi_write_file("E = ",&E,0x10,(FILE *)__stream), uVar1 == 0)) {
          printf(" ok\n  . Exporting the private key in rsa_priv.txt...");
          fflush(_stdout);
          __stream_00 = fopen("rsa_priv.txt","wb+");
          if (__stream_00 == (FILE *)0x0) {
            puts(" failed\n  ! could not open rsa_priv.txt for writing");
            iVar2 = 1;
            __stream_00 = (FILE *)0x0;
          }
          else {
            uVar1 = mbedtls_mpi_write_file("N = ",&N,0x10,(FILE *)__stream_00);
            if (((((uVar1 != 0) ||
                  (uVar1 = mbedtls_mpi_write_file("E = ",&E,0x10,(FILE *)__stream_00), uVar1 != 0))
                 || (uVar1 = mbedtls_mpi_write_file("D = ",&D,0x10,(FILE *)__stream_00), uVar1 != 0)
                 ) || ((uVar1 = mbedtls_mpi_write_file("P = ",&P,0x10,(FILE *)__stream_00),
                       uVar1 != 0 ||
                       (uVar1 = mbedtls_mpi_write_file("Q = ",&Q,0x10,(FILE *)__stream_00),
                       uVar1 != 0)))) ||
               ((uVar1 = mbedtls_mpi_write_file("DP = ",&DP,0x10,(FILE *)__stream_00), uVar1 != 0 ||
                ((uVar1 = mbedtls_mpi_write_file("DQ = ",&DQ,0x10,(FILE *)__stream_00), uVar1 != 0
                 || (uVar1 = mbedtls_mpi_write_file("QP = ",&QP,0x10,(FILE *)__stream_00),
                    uVar1 != 0)))))) goto LAB_0010758c;
            puts(" ok\n");
            iVar2 = 0;
          }
        }
        else {
          __stream_00 = (FILE *)0x0;
LAB_0010758c:
          printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)uVar1);
          iVar2 = 1;
        }
        fclose(__stream);
        if (__stream_00 != (FILE *)0x0) {
          fclose(__stream_00);
        }
        goto LAB_00107427;
      }
      pcVar3 = " failed\n  ! could not open rsa_pub.txt for writing\n";
    }
    else {
      pcVar3 = " failed\n  ! could not export RSA parameters\n";
    }
    puts(pcVar3);
  }
  else {
    pcVar3 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_0010741b:
    printf(pcVar3,(ulong)uVar1);
  }
  iVar2 = 1;
LAB_00107427:
  mbedtls_mpi_free(&N);
  mbedtls_mpi_free(&P);
  mbedtls_mpi_free(&Q);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&DP);
  mbedtls_mpi_free(&DQ);
  mbedtls_mpi_free(&QP);
  mbedtls_rsa_free(&rsa);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return iVar2;
}

Assistant:

int main( void )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    FILE *fpub  = NULL;
    FILE *fpriv = NULL;
    const char *pers = "rsa_genkey";

    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the RSA key [ %d-bit ]...", KEY_SIZE );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_gen_key( &rsa, mbedtls_ctr_drbg_random, &ctr_drbg, KEY_SIZE,
                                     EXPONENT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the public  key in rsa_pub.txt...." );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_export    ( &rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
        ( ret = mbedtls_rsa_export_crt( &rsa, &DP, &DQ, &QP ) )      != 0 )
    {
        mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
        goto exit;
    }

    if( ( fpub = fopen( "rsa_pub.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_pub.txt for writing\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = ", &N, 16, fpub ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = ", &E, 16, fpub ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the private key in rsa_priv.txt..." );
    fflush( stdout );

    if( ( fpriv = fopen( "rsa_priv.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_priv.txt for writing\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = " , &N , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = " , &E , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "D = " , &D , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "P = " , &P , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "Q = " , &Q , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DP = ", &DP, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DQ = ", &DQ, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "QP = ", &QP, 16, fpriv ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }
    mbedtls_printf( " ok\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( fpub  != NULL )
        fclose( fpub );

    if( fpriv != NULL )
        fclose( fpriv );

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );
    mbedtls_rsa_free( &rsa );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}